

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoldingSet.cpp
# Opt level: O1

Node * __thiscall llvm::FoldingSetBase::GetOrInsertNode(FoldingSetBase *this,Node *N)

{
  SmallVectorStorage<unsigned_int,_32U> *pSVar1;
  Node *pNVar2;
  void *IP;
  FoldingSetNodeID ID;
  void *local_b8;
  FoldingSetNodeID local_b0;
  
  pSVar1 = &local_b0.Bits.super_SmallVectorStorage<unsigned_int,_32U>;
  local_b0.Bits.super_SmallVectorImpl<unsigned_int>.
  super_SmallVectorTemplateBase<unsigned_int,_true>.
  super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.Size = 0;
  local_b0.Bits.super_SmallVectorImpl<unsigned_int>.
  super_SmallVectorTemplateBase<unsigned_int,_true>.
  super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.Capacity = 0x20;
  local_b0.Bits.super_SmallVectorImpl<unsigned_int>.
  super_SmallVectorTemplateBase<unsigned_int,_true>.
  super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.BeginX = pSVar1;
  (*this->_vptr_FoldingSetBase[1])(this,N,&local_b0);
  pNVar2 = FindNodeOrInsertPos(this,&local_b0,&local_b8);
  if (pNVar2 == (Node *)0x0) {
    InsertNode(this,N,local_b8);
    pNVar2 = N;
  }
  if ((SmallVectorStorage<unsigned_int,_32U> *)
      local_b0.Bits.super_SmallVectorImpl<unsigned_int>.
      super_SmallVectorTemplateBase<unsigned_int,_true>.
      super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.BeginX != pSVar1) {
    free(local_b0.Bits.super_SmallVectorImpl<unsigned_int>.
         super_SmallVectorTemplateBase<unsigned_int,_true>.
         super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.BeginX);
  }
  return pNVar2;
}

Assistant:

FoldingSetBase::Node *FoldingSetBase::GetOrInsertNode(FoldingSetBase::Node *N) {
  FoldingSetNodeID ID;
  GetNodeProfile(N, ID);
  void *IP;
  if (Node *E = FindNodeOrInsertPos(ID, IP))
    return E;
  InsertNode(N, IP);
  return N;
}